

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cc
# Opt level: O0

string * bssl::ReadTestFileToString(string *__return_storage_ptr__,string *file_path_ascii)

{
  char *path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *file_path_ascii_local;
  
  local_18 = file_path_ascii;
  file_path_ascii_local = __return_storage_ptr__;
  ::std::operator+(&local_38,"pki/",file_path_ascii);
  path = (char *)::std::__cxx11::string::c_str();
  GetTestData_abi_cxx11_(__return_storage_ptr__,path);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadTestFileToString(const std::string &file_path_ascii) {
  return GetTestData(("pki/" + file_path_ascii).c_str());
}